

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

void __thiscall mnf::Point::Point(Point *this,ConstSubPoint *other)

{
  PointMemory *this_00;
  Manifold *M;
  RefVec local_60;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_48;
  
  this_00 = &this->super_PointMemory;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_48,
             &(other->value_).
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            );
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)this_00,&local_48);
  free(local_48.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  this->_vptr_Point = (_func_int **)&PTR_format_0019a958;
  M = other->manifold_;
  PointMemory::getMem(this_00);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_60,
             (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(type *)0x0);
  SubPoint::SubPoint(&this->super_SubPoint,M,&local_60);
  this->_vptr_Point = (_func_int **)&PTR_format_0019a958;
  return;
}

Assistant:

Point::Point(const ConstSubPoint& other)
    : PointMemory(other.value()), SubPoint(other.getManifold(), getMem())
{
}